

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O1

MAP_HANDLE create_link_attach_properties(TWIN_MESSENGER_INSTANCE_conflict *twin_msgr)

{
  MAP_RESULT MVar1;
  MAP_HANDLE handle;
  char *pcVar2;
  size_t sVar3;
  char *__s;
  LOGGER_LOG p_Var4;
  int iVar5;
  char *pcVar6;
  size_t __size;
  
  handle = Map_Create((MAP_FILTER_CALLBACK)0x0);
  if (handle == (MAP_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (MAP_HANDLE)0x0;
    }
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
              ,"create_link_attach_properties",0x29f,1,
              "Failed creating map for AMQP link properties (%s)",twin_msgr->device_id);
    return (MAP_HANDLE)0x0;
  }
  pcVar2 = generate_unique_id();
  if (pcVar2 == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      __s = (char *)0x0;
    }
    else {
      __s = (char *)0x0;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"generate_twin_correlation_id",0x174,1,
                "Failed generating unique ID for correlation-id");
    }
  }
  else {
    sVar3 = strlen(pcVar2);
    __size = 0xffffffffffffffff;
    if (sVar3 < 0xfffffffffffffff8) {
      __size = sVar3 + 8;
    }
    if ((__size == 0xffffffffffffffff) || (__s = (char *)malloc(__size), __s == (char *)0x0)) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) {
        __s = (char *)0x0;
      }
      else {
        __s = (char *)0x0;
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"generate_twin_correlation_id",0x180,1,
                  "Failed allocating correlation-id, size:%zu",__size);
      }
    }
    else {
      sprintf(__s,"twin:%s",pcVar2);
    }
    free(pcVar2);
  }
  if (__s == (char *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"create_link_attach_properties",0x2a7,1,"Failed adding AMQP link property ");
    }
    Map_Destroy(handle);
    return (MAP_HANDLE)0x0;
  }
  pcVar2 = (*twin_msgr->prod_info_cb)(twin_msgr->prod_info_ctx);
  MVar1 = Map_Add(handle,"com.microsoft:client-version",pcVar2);
  if (MVar1 == MAP_OK) {
    MVar1 = Map_Add(handle,"com.microsoft:channel-correlation-id",__s);
    if (MVar1 == MAP_OK) {
      MVar1 = Map_Add(handle,"com.microsoft:api-version","2020-09-30");
      if (MVar1 == MAP_OK) goto LAB_001391eb;
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar2 = twin_msgr->device_id;
        pcVar6 = "Failed adding AMQP link property \'api-version\' (%s)";
        iVar5 = 699;
        goto LAB_001391d6;
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        pcVar2 = twin_msgr->device_id;
        pcVar6 = "Failed adding AMQP link property \'correlation-id\' (%s)";
        iVar5 = 0x2b5;
        goto LAB_001391d6;
      }
    }
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar2 = twin_msgr->device_id;
      pcVar6 = "Failed adding AMQP link property \'client version\' (%s)";
      iVar5 = 0x2af;
LAB_001391d6:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"create_link_attach_properties",iVar5,1,pcVar6,pcVar2);
    }
  }
  Map_Destroy(handle);
  handle = (MAP_HANDLE)0x0;
LAB_001391eb:
  free(__s);
  return handle;
}

Assistant:

static MAP_HANDLE create_link_attach_properties(TWIN_MESSENGER_INSTANCE* twin_msgr)
{
    MAP_HANDLE result;

    if ((result = Map_Create(NULL)) == NULL)
    {
        LogError("Failed creating map for AMQP link properties (%s)", twin_msgr->device_id);
    }
    else
    {
        char* correlation_id;

        if ((correlation_id = generate_twin_correlation_id()) == NULL)
        {
            LogError("Failed adding AMQP link property ");
            destroy_link_attach_properties(result);
            result = NULL;
        }
        else
        {
            if (Map_Add(result, CLIENT_VERSION_PROPERTY_NAME, twin_msgr->prod_info_cb(twin_msgr->prod_info_ctx) ) != MAP_OK)
            {
                LogError("Failed adding AMQP link property 'client version' (%s)", twin_msgr->device_id);
                destroy_link_attach_properties(result);
                result = NULL;
            }
            else if (Map_Add(result, TWIN_CORRELATION_ID_PROPERTY_NAME, correlation_id) != MAP_OK)
            {
                LogError("Failed adding AMQP link property 'correlation-id' (%s)", twin_msgr->device_id);
                destroy_link_attach_properties(result);
                result = NULL;
            }
            else if (Map_Add(result, TWIN_API_VERSION_PROPERTY_NAME, IOTHUB_API_VERSION) != MAP_OK)
            {
                LogError("Failed adding AMQP link property 'api-version' (%s)", twin_msgr->device_id);
                destroy_link_attach_properties(result);
                result = NULL;
            }

            free(correlation_id);
        }
    }

    return result;
}